

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void displayMessage(MessageType t,ostringstream *msg)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  int in_ECX;
  long *plVar4;
  string stack;
  string local_a0;
  long *local_80 [2];
  long local_70 [2];
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  if (t == AUTHOR_WARNING) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)msg,
               "This warning is for project developers.  Use -Wno-dev to suppress it.",0x45);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)msg,"\n",1);
LAB_00242b5f:
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message(local_a0._M_dataplus._M_p,"Warning");
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)msg,"\n",1);
    if ((t != FATAL_ERROR) && (t != DEPRECATION_ERROR)) {
      if (t != INTERNAL_ERROR) goto LAB_00242b5f;
      cmsys::SystemInformation::GetProgramStack_abi_cxx11_
                (&local_a0,(SystemInformation *)0x0,0,in_ECX);
      if (local_a0._M_string_length != 0) {
        local_40[0] = local_30;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_40,local_a0._M_dataplus._M_p,
                   local_a0._M_dataplus._M_p + local_a0._M_string_length);
        plVar2 = local_40[0];
        iVar1 = strncmp((char *)local_40[0],"WARNING:",8);
        if (plVar2 != local_30) {
          operator_delete(plVar2,local_30[0] + 1);
        }
        if (iVar1 == 0) {
          std::__cxx11::string::substr((ulong)local_80,(ulong)&local_a0);
          plVar2 = (long *)std::__cxx11::string::replace((ulong)local_80,0,(char *)0x0,0x4afd50);
          plVar4 = plVar2 + 2;
          if ((long *)*plVar2 == plVar4) {
            local_50 = *plVar4;
            lStack_48 = plVar2[3];
            local_60 = &local_50;
          }
          else {
            local_50 = *plVar4;
            local_60 = (long *)*plVar2;
          }
          local_58 = plVar2[1];
          *plVar2 = (long)plVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_60);
          if (local_60 != &local_50) {
            operator_delete(local_60,local_50 + 1);
          }
          if (local_80[0] != local_70) {
            operator_delete(local_80[0],local_70[0] + 1);
          }
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)msg,local_a0._M_dataplus._M_p,local_a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
    cmSystemTools::s_ErrorOccured = true;
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message(local_a0._M_dataplus._M_p,"Error");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void displayMessage(cmake::MessageType t, std::ostringstream& msg)
{

  // Add a note about warning suppression.
  if(t == cmake::AUTHOR_WARNING)
    {
    msg <<
      "This warning is for project developers.  Use -Wno-dev to suppress it.";
    }

  // Add a terminating blank line.
  msg << "\n";

#if defined(CMAKE_BUILD_WITH_CMAKE)
  // Add a C++ stack trace to internal errors.
  if(t == cmake::INTERNAL_ERROR)
    {
    std::string stack = cmsys::SystemInformation::GetProgramStack(0,0);
    if(!stack.empty())
      {
      if(cmHasLiteralPrefix(stack, "WARNING:"))
        {
        stack = "Note:" + stack.substr(8);
        }
      msg << stack << "\n";
      }
    }
#endif

  // Output the message.
  if(t == cmake::FATAL_ERROR
     || t == cmake::INTERNAL_ERROR
     || t == cmake::DEPRECATION_ERROR)
    {
    cmSystemTools::SetErrorOccured();
    cmSystemTools::Message(msg.str().c_str(), "Error");
    }
  else
    {
    cmSystemTools::Message(msg.str().c_str(), "Warning");
    }
}